

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O0

void Minisat::limitMemory(uint64_t max_mem_mb)

{
  int iVar1;
  undefined1 local_28 [8];
  rlimit rl;
  rlim_t new_mem_lim;
  uint64_t max_mem_mb_local;
  
  if (max_mem_mb != 0) {
    rl.rlim_max = max_mem_mb << 0x14;
    getrlimit(RLIMIT_AS,(rlimit *)local_28);
    if ((rl.rlim_cur == 0xffffffffffffffff) || (rl.rlim_max < rl.rlim_cur)) {
      local_28 = (undefined1  [8])rl.rlim_max;
      iVar1 = setrlimit(RLIMIT_AS,(rlimit *)local_28);
      if (iVar1 == -1) {
        printf("WARNING! Could not set resource limit: Virtual memory.\n");
      }
    }
  }
  return;
}

Assistant:

void Minisat::limitMemory(uint64_t max_mem_mb)
{
// FIXME: OpenBSD does not support RLIMIT_AS. Not sure how well RLIMIT_DATA works instead.
#if defined(__OpenBSD__)
#define RLIMIT_AS RLIMIT_DATA
#endif

    // Set limit on virtual memory:
    if (max_mem_mb != 0){
        rlim_t new_mem_lim = (rlim_t)max_mem_mb * 1024*1024;
        rlimit rl;
        getrlimit(RLIMIT_AS, &rl);
        if (rl.rlim_max == RLIM_INFINITY || new_mem_lim < rl.rlim_max){
            rl.rlim_cur = new_mem_lim;
            if (setrlimit(RLIMIT_AS, &rl) == -1)
                printf("WARNING! Could not set resource limit: Virtual memory.\n");
        }
    }

#if defined(__OpenBSD__)
#undef RLIMIT_AS
#endif
}